

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::mouseReleaseEvent(Picker *this,QMouseEvent *event)

{
  int iVar1;
  MouseButton MVar2;
  uint uVar3;
  PickerPrivate *pPVar4;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QPoint local_20;
  QEvent *local_18;
  QMouseEvent *event_local;
  Picker *this_local;
  QPoint *pos;
  
  local_18 = (QEvent *)event;
  event_local = (QMouseEvent *)this;
  MVar2 = QSinglePointEvent::button((QSinglePointEvent *)event);
  __fd = (int)event;
  if (MVar2 != LeftButton) {
    QEvent::ignore(local_18);
    return;
  }
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  pPVar4->leftMouseButtonPressed = false;
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  if ((pPVar4->mouseWasMoved & 1U) != 0) {
    pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    iVar1 = pPVar4->mouseMoveDelta;
    uVar3 = FingerGeometry::touchBounce();
    in_RCX = (socklen_t *)(ulong)uVar3;
    __addr = extraout_RDX;
    if ((int)uVar3 < iVar1) goto LAB_001eb396;
  }
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  local_20 = QMouseEvent::pos((QMouseEvent *)local_18);
  pos = &local_20;
  PickerPrivate::setCurrentIndex(pPVar4,pos);
  __fd = (int)pos;
  __addr = extraout_RDX_00;
LAB_001eb396:
  QEvent::accept(local_18,__fd,__addr,in_RCX);
  return;
}

Assistant:

void
Picker::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->leftMouseButtonPressed = false;

		if( !d->mouseWasMoved
			|| d->mouseMoveDelta <= FingerGeometry::touchBounce() )
				d->setCurrentIndex( event->pos() );

		event->accept();
	}
	else
		event->ignore();
}